

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGeneratorTests.cpp
# Opt level: O2

void __thiscall
solitaire::cards::ShuffledDeckGeneratorTest_generateShuffledDeck_Test::
~ShuffledDeckGeneratorTest_generateShuffledDeck_Test
          (ShuffledDeckGeneratorTest_generateShuffledDeck_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(ShuffledDeckGeneratorTest, generateShuffledDeck) {
    auto generatedDeck = generator.generate();

    EXPECT_FALSE(std::is_sorted(
        generatedDeck.begin(), generatedDeck.end(), cardsComparator
    ));

    std::sort(generatedDeck.begin(), generatedDeck.end(), cardsComparator);
    EXPECT_THAT(generatedDeck, ContainerEq(createSortedDeck()));
}